

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O0

void __thiscall
CRenderTools::RenderTilemap
          (CRenderTools *this,CTile *pTiles,int w,int h,float Scale,vec4 Color,int RenderFlags,
          ENVELOPE_EVAL pfnEval,void *pUser,int ColorEnv,int ColorEnvOffset)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  IGraphics *pIVar6;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  CRenderTools *in_RDI;
  uint in_R8D;
  code *in_R9;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar7;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  float in_XMM2_Db;
  float Tmp;
  float y3;
  float x3;
  float y2;
  float x2;
  float y1;
  float x1;
  float y0;
  float x0;
  bool Render;
  uchar Flags;
  uchar Index;
  int c;
  int my;
  int mx;
  int x;
  int y;
  int EndX;
  int EndY;
  int StartX;
  int StartY;
  float Alpha;
  float a;
  float b;
  float g;
  float r;
  CQuadItem QuadItem;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  float aChannels [4];
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  CQuadItem local_38;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar6 = Graphics(in_RDI);
  (*(pIVar6->super_IInterface)._vptr_IInterface[6])(pIVar6,&local_1c,&local_20,&local_24,&local_28);
  local_74 = 1.0;
  local_78 = 1.0;
  local_7c = 1.0;
  local_80 = 1.0;
  if (-1 < (int)x3) {
    (*in_R9)((float)(int)x2 / 1000.0,x3,&local_18,_Tmp);
    local_74 = local_18;
    local_78 = local_14;
    local_7c = local_10;
    local_80 = local_c;
  }
  pIVar6 = Graphics(in_RDI);
  (*(pIVar6->super_IInterface)._vptr_IInterface[0x17])();
  fVar7 = in_XMM2_Db * local_80;
  pIVar6 = Graphics(in_RDI);
  (*(pIVar6->super_IInterface)._vptr_IInterface[0x21])
            (in_XMM1_Da * local_74 * fVar7,in_XMM1_Db * local_78 * fVar7,
             in_XMM2_Da * local_7c * fVar7,fVar7);
  local_98 = (int)(local_20 / in_XMM0_Da) + -1;
  do {
    local_9c = (int)(local_1c / in_XMM0_Da) + -1;
    if ((int)(local_28 / in_XMM0_Da) + 1 <= local_98) {
      pIVar6 = Graphics(in_RDI);
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x18])();
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    for (; local_9c < (int)(local_24 / in_XMM0_Da) + 1; local_9c = local_9c + 1) {
      local_a0 = local_9c;
      local_a4 = local_98;
      if ((in_R8D & 4) == 0) {
        if ((((-1 < local_9c) && (local_9c < in_EDX)) && (-1 < local_98)) && (local_98 < in_ECX))
        goto LAB_001db51d;
      }
      else {
        if (local_9c < 0) {
          local_a0 = 0;
        }
        if (in_EDX <= local_a0) {
          local_a0 = in_EDX + -1;
        }
        if (local_98 < 0) {
          local_a4 = 0;
        }
        if (in_ECX <= local_a4) {
          local_a4 = in_ECX + -1;
        }
LAB_001db51d:
        local_a0 = local_a0 + local_a4 * in_EDX;
        bVar1 = *(byte *)(in_RSI + (long)local_a0 * 4);
        if (bVar1 != 0) {
          bVar2 = *(byte *)(in_RSI + 1 + (long)local_a0 * 4);
          if (((bVar2 & 4) == 0) || (in_XMM2_Db * local_80 <= 0.99607843)) {
            uVar5 = in_R8D & 2;
          }
          else {
            uVar5 = in_R8D & 1;
          }
          if (uVar5 != 0) {
            local_b0 = 0;
            local_b4 = 0;
            local_b8 = 0x3f800000;
            local_bc = 0;
            local_c0 = 0x3f800000;
            local_c4 = 0x3f800000;
            local_c8 = 0;
            local_cc = 0x3f800000;
            if ((bVar2 & 1) != 0) {
              local_b0 = 0x3f800000;
              local_b8 = 0;
              local_c0 = 0;
              local_c8 = 0x3f800000;
            }
            uVar4 = local_b0;
            if ((bVar2 & 2) != 0) {
              local_b4 = 0x3f800000;
              local_c4 = 0;
              local_cc = 0;
              local_bc = 0x3f800000;
            }
            uVar3 = local_b4;
            if ((bVar2 & 8) != 0) {
              local_b0 = local_c8;
              local_c8 = local_c0;
              local_c0 = local_b8;
              local_b8 = uVar4;
              local_b4 = local_cc;
              local_cc = local_c4;
              local_c4 = local_bc;
              local_bc = uVar3;
            }
            pIVar6 = Graphics(in_RDI);
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x1b])
                      (local_b0,local_b4,local_b8,local_bc,local_c0,local_c4,local_c8,local_cc,
                       pIVar6,(ulong)bVar1);
            IGraphics::CQuadItem::CQuadItem
                      (&local_38,(float)local_9c * in_XMM0_Da,(float)local_98 * in_XMM0_Da,
                       in_XMM0_Da,in_XMM0_Da);
            pIVar6 = Graphics(in_RDI);
            (*(pIVar6->super_IInterface)._vptr_IInterface[0x1d])(pIVar6,&local_38,1);
          }
        }
        local_9c = (uint)*(byte *)(in_RSI + 2 + (long)local_a0 * 4) + local_9c;
      }
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

void CRenderTools::RenderTilemap(const CTile *pTiles, int w, int h, float Scale, vec4 Color, int RenderFlags,
									ENVELOPE_EVAL pfnEval, void *pUser, int ColorEnv, int ColorEnvOffset)
{
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	float r=1, g=1, b=1, a=1;
	if(ColorEnv >= 0)
	{
		float aChannels[4];
		pfnEval(ColorEnvOffset/1000.0f, ColorEnv, aChannels, pUser);
		r = aChannels[0];
		g = aChannels[1];
		b = aChannels[2];
		a = aChannels[3];
	}

	Graphics()->QuadsBegin();
	const float Alpha = Color.a*a;
	Graphics()->SetColor(Color.r*r*Alpha, Color.g*g*Alpha, Color.b*b*Alpha, Alpha);

	int StartY = (int)(ScreenY0/Scale)-1;
	int StartX = (int)(ScreenX0/Scale)-1;
	int EndY = (int)(ScreenY1/Scale)+1;
	int EndX = (int)(ScreenX1/Scale)+1;

	for(int y = StartY; y < EndY; y++)
		for(int x = StartX; x < EndX; x++)
		{
			int mx = x;
			int my = y;

			if(RenderFlags&TILERENDERFLAG_EXTEND)
			{
				if(mx<0)
					mx = 0;
				if(mx>=w)
					mx = w-1;
				if(my<0)
					my = 0;
				if(my>=h)
					my = h-1;
			}
			else
			{
				if(mx<0)
					continue; // mx = 0;
				if(mx>=w)
					continue; // mx = w-1;
				if(my<0)
					continue; // my = 0;
				if(my>=h)
					continue; // my = h-1;
			}

			int c = mx + my*w;

			unsigned char Index = pTiles[c].m_Index;
			if(Index)
			{
				unsigned char Flags = pTiles[c].m_Flags;

				bool Render = false;
				if(Flags&TILEFLAG_OPAQUE && Color.a*a > 254.0f/255.0f)
				{
					if(RenderFlags&LAYERRENDERFLAG_OPAQUE)
						Render = true;
				}
				else
				{
					if(RenderFlags&LAYERRENDERFLAG_TRANSPARENT)
						Render = true;
				}

				if(Render)
				{
					float x0 = 0;
					float y0 = 0;
					float x1 = 1;
					float y1 = 0;
					float x2 = 1;
					float y2 = 1;
					float x3 = 0;
					float y3 = 1;

					if(Flags&TILEFLAG_VFLIP)
					{
						x0 = x2;
						x1 = x3;
						x2 = x3;
						x3 = x0;
					}

					if(Flags&TILEFLAG_HFLIP)
					{
						y0 = y3;
						y2 = y1;
						y3 = y1;
						y1 = y0;
					}

					if(Flags&TILEFLAG_ROTATE)
					{
						float Tmp = x0;
						x0 = x3;
						x3 = x2;
						x2 = x1;
						x1 = Tmp;
						Tmp = y0;
						y0 = y3;
						y3 = y2;
						y2 = y1;
						y1 = Tmp;
					}

					Graphics()->QuadsSetSubsetFree(x0, y0, x1, y1, x2, y2, x3, y3, Index);
					IGraphics::CQuadItem QuadItem(x*Scale, y*Scale, Scale, Scale);
					Graphics()->QuadsDrawTL(&QuadItem, 1);
				}
			}
			x += pTiles[c].m_Skip;
		}

	Graphics()->QuadsEnd();
}